

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall flatbuffers::Parser::ParseFlexBufferValue(Parser *this,Builder *builder)

{
  pointer pVVar1;
  pointer pVVar2;
  size_t len;
  anon_union_8_3_83789bcb_for_Value_0 *paVar3;
  double dVar4;
  int iVar5;
  int *piVar6;
  longlong lVar7;
  Builder *in_RDX;
  int t;
  int64_t i;
  char cVar8;
  long lVar9;
  CheckedError *ce;
  bool bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  size_type __dnew;
  char *endptr;
  undefined1 local_60 [8];
  anon_union_8_3_83789bcb_for_Value_0 *local_58;
  char *local_50;
  anon_union_8_3_83789bcb_for_Value_0 local_48 [2];
  _Alloc_hider local_38;
  
  iVar5 = *(int *)((long)&builder[0xb].string_pool._M_t._M_impl.super__Rb_tree_header._M_node_count
                  + 4);
  if (0x40 < iVar5) {
    __assert_fail("caller_depth_ <= (FLATBUFFERS_MAX_PARSING_DEPTH) && \"Check() must be called to prevent stack overflow\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                  ,0x19d,"flatbuffers::Parser::ParseDepthGuard::ParseDepthGuard(Parser *)");
  }
  *(int *)((long)&builder[0xb].string_pool._M_t._M_impl.super__Rb_tree_header._M_node_count + 4) =
       iVar5 + 1;
  if (iVar5 == 0x40) {
    RecurseError(this);
  }
  else {
    *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
  }
  *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
  if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00120190;
  iVar5 = *(int *)((long)&(builder->stack_).
                          super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4);
  t = (int)builder;
  if (iVar5 < 0x7b) {
    if ((iVar5 == 0x2b) || (iVar5 == 0x2d)) {
      Next(this);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00120190;
      if (*(int *)((long)&(builder->stack_).
                          super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start + 4) != 0x104) {
        local_58 = local_48;
        local_60 = (undefined1  [8])0x20;
        local_58 = (anon_union_8_3_83789bcb_for_Value_0 *)
                   std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)local_60);
        local_48[0].i_ = (int64_t)local_60;
        local_58[2] = (anon_union_8_3_83789bcb_for_Value_0)0x20746e6174736e6f;
        local_58[3] = (anon_union_8_3_83789bcb_for_Value_0)0x6465746365707865;
        *local_58 = (anon_union_8_3_83789bcb_for_Value_0)0x676e6974616f6c66;
        local_58[1] = (anon_union_8_3_83789bcb_for_Value_0)0x6320746e696f702d;
        local_50 = (char *)local_60;
        *(char *)((long)local_60 + (long)local_58) = '\0';
        Error(this,(string *)builder);
LAB_001200b2:
        if (local_58 != local_48) {
          operator_delete(local_58,(ulong)(local_48[0].i_ + 1));
        }
        goto LAB_00120190;
      }
      std::__cxx11::string::insert
                ((ulong)&(builder->stack_).
                         super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0,'\x01');
      ParseFlexBufferNumericConstant(this,builder);
      *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00120190;
      Next(this);
      goto LAB_0012017f;
    }
    if (iVar5 != 0x5b) goto LAB_0011ff28;
    pVVar1 = (in_RDX->stack_).
             super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pVVar2 = (in_RDX->stack_).
             super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    Expect(this,t);
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
      lVar9 = 0;
      do {
        bVar10 = lVar9 == 0;
        lVar9 = lVar9 + -1;
        if ((bVar10 || (~*(byte *)((long)&builder[6].stack_.
                                          super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) &
                       1) != 0) &&
           (*(int *)((long)&(builder->stack_).
                            super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                            ._M_impl.super__Vector_impl_data._M_start + 4) == 0x5d)) {
LAB_001200ff:
          Next(this);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') {
            *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
          }
          break;
        }
        ParseFlexBufferValue(this,builder);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') break;
        if (*(int *)((long)&(builder->stack_).
                            super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                            ._M_impl.super__Vector_impl_data._M_start + 4) == 0x5d)
        goto LAB_001200ff;
        if ((char)builder[8].key_pool._M_t._M_impl.super__Rb_tree_header._M_header._M_color ==
            _S_red) {
          Expect(this,t);
          *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
          if (*(char *)&(this->super_ParserState).prev_cursor_ == '\0') goto LAB_0011fb89;
        }
        else {
LAB_0011fb89:
          *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
        }
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
      } while (*(char *)&(this->super_ParserState).prev_cursor_ == '\0');
    }
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00120190;
    flexbuffers::Builder::EndVector(in_RDX,(long)pVVar1 - (long)pVVar2 >> 4,false,false);
  }
  else {
    switch(iVar5) {
    case 0x101:
      len._0_1_ = builder->finished_;
      len._1_1_ = builder->has_duplicate_keys_;
      len._2_2_ = *(undefined2 *)&builder->field_0x32;
      len._4_4_ = builder->flags_;
      flexbuffers::Builder::String
                (in_RDX,(char *)(builder->stack_).
                                super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,len);
      Expect(this,t);
      break;
    case 0x102:
      paVar3 = &((builder->stack_).
                 super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0;
      if (paVar3 == (anon_union_8_3_83789bcb_for_Value_0 *)0x0) {
        __assert_fail("str",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                      ,0x11f,
                      "bool flatbuffers::StringToIntegerImpl(T *, const char *const, const int, const bool) [T = long]"
                     );
      }
      piVar6 = __errno_location();
      *piVar6 = 0;
      local_58 = paVar3;
      lVar7 = strtoll_l((char *)&paVar3->i_,(char **)&local_58,10,ClassicLocale::instance_);
      i = 0;
      if (((local_58 != paVar3) && (*(char *)local_58 == '\0')) && (i = 0, *piVar6 == 0)) {
        i = lVar7;
      }
      flexbuffers::Builder::Int(in_RDX,i);
      Expect(this,t);
      break;
    case 0x103:
      paVar3 = &((builder->stack_).
                 super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->field_0;
      if (paVar3 == (anon_union_8_3_83789bcb_for_Value_0 *)0x0) {
        __assert_fail("str && val",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                      ,0x138,
                      "bool flatbuffers::StringToFloatImpl(T *, const char *const) [T = double]");
      }
      local_58 = paVar3;
      dVar4 = strtod_l((char *)&paVar3->i_,(char **)&local_58,ClassicLocale::instance_);
      uVar11 = 0;
      uVar12 = 0;
      if ((local_58 != paVar3) && (*(char *)local_58 == '\0')) {
        uVar11 = SUB84(dVar4,0);
        uVar12 = (undefined4)((ulong)dVar4 >> 0x20);
        if (NAN(dVar4)) {
          uVar11 = 0;
          uVar12 = 0x7ff80000;
        }
      }
      flexbuffers::Builder::Double(in_RDX,(double)CONCAT44(uVar12,uVar11));
      Expect(this,t);
      break;
    case 0x104:
      iVar5 = std::__cxx11::string::compare
                        ((char *)&(builder->stack_).
                                  super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (iVar5 != 0) goto LAB_0011ff28;
      flexbuffers::Builder::Bool(in_RDX,true);
      Next(this);
      break;
    default:
      if (iVar5 == 0x7b) {
        local_38._M_p =
             (pointer)((long)(in_RDX->stack_).
                             super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(in_RDX->stack_).
                            super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                            ._M_impl.super__Vector_impl_data._M_start);
        Expect((Parser *)local_60,t);
        local_60[1] = 1;
        if (local_60[0] == '\0') {
          lVar9 = 0;
          do {
            if (((byte)(lVar9 == 0 |
                       *(byte *)((long)&builder[6].stack_.
                                        super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) ^ 1)
                 == 1) &&
               (*(int *)((long)&(builder->stack_).
                                super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4) == 0x7d))
            goto LAB_0011fe14;
            local_58 = local_48;
            local_50 = (char *)0x0;
            local_48[0].u_ = local_48[0].u_ & 0xffffffffffffff00;
            std::__cxx11::string::_M_assign((string *)&local_58);
            if (*(int *)((long)&(builder->stack_).
                                super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4) == 0x101) {
              Next((Parser *)local_60);
            }
            else {
              Expect((Parser *)local_60,t);
            }
            local_60[1] = 1;
            cVar8 = '\x01';
            if (local_60[0] == '\0') {
              if (((char)builder[8].key_pool._M_t._M_impl.super__Rb_tree_header._M_header._M_color
                   != _S_black) ||
                 ((*(uint *)((long)&(builder->stack_).
                                    super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_start + 4) | 0x20) != 0x7b))
              {
                Expect((Parser *)local_60,t);
                local_60[1] = 1;
                cVar8 = '\x01';
                if (local_60[0] != '\0') goto LAB_0011fde9;
              }
              flexbuffers::Builder::Key(in_RDX,(char *)&local_58->i_,(size_t)local_50);
              ParseFlexBufferValue((Parser *)local_60,builder);
              if (local_60[0] == '\0') {
                lVar9 = lVar9 + 1;
                local_60[0] = '\0';
              }
              local_60[1] = 1;
              cVar8 = '\x01';
              if ((local_60[0] == '\0') &&
                 (cVar8 = '\x02',
                 *(int *)((long)&(builder->stack_).
                                 super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 4) != 0x7d)) {
                if ((char)builder[8].key_pool._M_t._M_impl.super__Rb_tree_header._M_header._M_color
                    == _S_red) {
                  Expect((Parser *)local_60,t);
                  local_60[1] = 0;
                  if (local_60[0] == 0) goto LAB_0011fdd7;
                }
                else {
LAB_0011fdd7:
                  local_60 = (undefined1  [8])((ulong)local_60 & 0xffffffffffff0000);
                }
                local_60[1] = 1;
                cVar8 = local_60[0];
              }
            }
LAB_0011fde9:
            if (local_58 != local_48) {
              operator_delete(local_58,(ulong)(local_48[0].i_ + 1));
            }
          } while (cVar8 == '\0');
          if (cVar8 == '\x02') {
LAB_0011fe14:
            Next((Parser *)local_60);
            local_60[1] = 0;
            if (local_60[0] == 0) {
              local_60 = (undefined1  [8])((ulong)(uint6)local_60._2_6_ << 0x10);
            }
          }
        }
        *(byte *)&(this->super_ParserState).prev_cursor_ = local_60[0];
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 0;
        local_60[1] = 1;
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (local_60[0] != '\0') goto LAB_00120190;
        flexbuffers::Builder::EndMap(in_RDX,(long)local_38._M_p >> 4);
        if (in_RDX->has_duplicate_keys_ == true) {
          local_58 = local_48;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"FlexBuffers map has duplicate keys","");
          Error(this,(string *)builder);
          goto LAB_001200b2;
        }
        goto LAB_0012018a;
      }
LAB_0011ff28:
      if ((*(int *)((long)&(builder->stack_).
                           super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                           ._M_impl.super__Vector_impl_data._M_start + 4) == 0x104) &&
         (iVar5 = std::__cxx11::string::compare
                            ((char *)&(builder->stack_).
                                      super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage),
         iVar5 == 0)) {
        flexbuffers::Builder::Bool(in_RDX,false);
        Next(this);
      }
      else if ((*(int *)((long)&(builder->stack_).
                                super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                ._M_impl.super__Vector_impl_data._M_start + 4) == 0x104) &&
              (iVar5 = std::__cxx11::string::compare
                                 ((char *)&(builder->stack_).
                                           super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage),
              iVar5 == 0)) {
        flexbuffers::Builder::Null(in_RDX);
        Next(this);
      }
      else {
        if ((((*(int *)((long)&(builder->stack_).
                               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                               ._M_impl.super__Vector_impl_data._M_start + 4) != 0x104) ||
             (iVar5 = std::__cxx11::string::compare
                                ((char *)&(builder->stack_).
                                          super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage),
             iVar5 != 0)) &&
            ((*(int *)((long)&(builder->stack_).
                              super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                              ._M_impl.super__Vector_impl_data._M_start + 4) != 0x104 ||
             (iVar5 = std::__cxx11::string::compare
                                ((char *)&(builder->stack_).
                                          super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage),
             iVar5 != 0)))) &&
           ((*(int *)((long)&(builder->stack_).
                             super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                             ._M_impl.super__Vector_impl_data._M_start + 4) != 0x104 ||
            (iVar5 = std::__cxx11::string::compare
                               ((char *)&(builder->stack_).
                                         super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage),
            iVar5 != 0)))) {
          TokenError(this);
          goto LAB_00120190;
        }
        ParseFlexBufferNumericConstant(this,builder);
        *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
        if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00120190;
        Next(this);
      }
    }
LAB_0012017f:
    *(undefined1 *)((long)&(this->super_ParserState).prev_cursor_ + 1) = 1;
    if (*(char *)&(this->super_ParserState).prev_cursor_ != '\0') goto LAB_00120190;
  }
LAB_0012018a:
  *(undefined2 *)&(this->super_ParserState).prev_cursor_ = 0;
LAB_00120190:
  piVar6 = (int *)((long)&builder[0xb].string_pool._M_t._M_impl.super__Rb_tree_header._M_node_count
                  + 4);
  *piVar6 = *piVar6 + -1;
  return SUB82(this,0);
}

Assistant:

explicit ParseDepthGuard(Parser *parser_not_null)
      : parser_(*parser_not_null), caller_depth_(parser_.parse_depth_counter_) {
    FLATBUFFERS_ASSERT(caller_depth_ <= (FLATBUFFERS_MAX_PARSING_DEPTH) &&
                       "Check() must be called to prevent stack overflow");
    parser_.parse_depth_counter_ += 1;
  }